

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

CURLcode file_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  Curl_easy *data_00;
  undefined8 *puVar1;
  char *pcVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  curl_off_t cVar9;
  __off64_t _Var10;
  size_t len;
  size_t sVar11;
  size_t sVar12;
  undefined8 uVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  long lVar17;
  size_t sVar18;
  bool bVar19;
  bool bVar20;
  curltime cVar21;
  ulong local_168;
  long local_160;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data = conn->data;
  pcVar16 = (data->state).buffer;
  *done = true;
  Curl_initinfo(data);
  Curl_pgrsStartNow(data);
  data_00 = conn->data;
  puVar1 = (undefined8 *)(data_00->req).protop;
  if ((data->set).upload != true) {
    iVar4 = *(int *)(puVar1 + 2);
    iVar6 = fstat64(iVar4,(stat64 *)&statbuf);
    lVar17 = statbuf.st_size;
    if (iVar6 == -1) {
      lVar17 = 0;
    }
    else {
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var3 = Curl_meets_timecondition(data,(data->info).filetime), !_Var3)) {
        *done = true;
        return CURLE_OK;
      }
    }
    if ((((data->set).opt_no_body == true) && (iVar6 != -1)) &&
       ((data->set).include_header != false)) {
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar5 = Curl_client_write(conn,3,header,0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      CVar5 = Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      CVar5 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      iVar4 = 6;
      if (buffer.tm_wday != 0) {
        iVar4 = buffer.tm_wday + -1;
      }
      curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                     Curl_wkday[iVar4],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                     (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                     (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec);
      CVar5 = Curl_client_write(conn,3,header,0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      Curl_pgrsSetDownloadSize(data,lVar17);
      return CURLE_OK;
    }
    CVar5 = Curl_range(conn);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    lVar15 = (data->state).resume_from;
    if (lVar15 < 0) {
      if (iVar6 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      (data->state).resume_from = lVar15 + statbuf.st_size;
    }
    lVar15 = (data->state).resume_from;
    if (lVar17 < lVar15) {
      Curl_failf(data,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    bVar19 = iVar6 == -1;
    uVar14 = (data->req).maxdownload;
    local_168 = lVar17 - lVar15;
    if (0 < (long)uVar14) {
      local_168 = uVar14;
    }
    bVar20 = local_168 == 0;
    if (iVar6 != -1) {
      Curl_pgrsSetDownloadSize(data,local_168);
    }
    lVar17 = (data->state).resume_from;
    uVar14 = local_168;
    if (lVar17 != 0) {
      _Var10 = lseek64(iVar4,lVar17,0);
      uVar14 = 0x24;
      if (lVar17 != _Var10) {
        return CURLE_BAD_DOWNLOAD_RESUME;
      }
    }
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    lVar17 = 0;
    CVar5 = CURLE_OK;
    do {
      if (CVar5 != CURLE_OK) goto LAB_0010a94a;
      if (bVar19 || bVar20) {
        sVar18 = (data->set).buffer_size - 1;
      }
      else {
        sVar18 = (data->set).buffer_size;
        if ((long)local_168 < (long)sVar18) {
          sVar18 = curlx_sotouz(local_168);
        }
      }
      len = read(iVar4,pcVar16,sVar18);
      if (0 < (long)len) {
        pcVar16[len] = '\0';
      }
      iVar6 = 3;
      if ((0 < (long)len) && (local_168 != 0 || (bVar19 || bVar20))) {
        lVar17 = lVar17 + len;
        sVar12 = len;
        if (bVar19 || bVar20) {
          sVar12 = 0;
        }
        local_168 = local_168 - sVar12;
        iVar6 = 1;
        CVar5 = Curl_client_write(conn,1,pcVar16,len);
        if (CVar5 == CURLE_OK) {
          Curl_pgrsSetDownloadCounter(data,lVar17);
          iVar7 = Curl_pgrsUpdate(conn);
          CVar5 = CURLE_ABORTED_BY_CALLBACK;
          iVar6 = 0;
          if (iVar7 == 0) {
            cVar21 = Curl_now();
            CVar5 = Curl_speedcheck(data,cVar21);
          }
        }
        else {
          uVar14 = (ulong)CVar5;
        }
      }
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      return (CURLcode)uVar14;
    }
LAB_0010a94a:
    iVar4 = Curl_pgrsUpdate(conn);
    if (iVar4 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    return CVar5;
  }
  pcVar16 = (char *)*puVar1;
  pcVar8 = strchr(pcVar16,0x2f);
  pcVar2 = (data_00->state).buffer;
  (data_00->req).upload_fromhere = pcVar2;
  if (pcVar8 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar8[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar4 = open64(pcVar16,(uint)((data_00->state).resume_from != 0) * 0x200 + 0x241,
                 (data_00->set).new_file_perms);
  if (iVar4 < 0) {
    uVar13 = *puVar1;
    pcVar16 = "Can\'t open %s for writing";
LAB_0010a985:
    Curl_failf(data_00,pcVar16,uVar13);
    CVar5 = CURLE_WRITE_ERROR;
  }
  else {
    lVar17 = (data_00->state).infilesize;
    if (lVar17 != -1) {
      Curl_pgrsSetUploadSize(data_00,lVar17);
    }
    if ((data_00->state).resume_from < 0) {
      iVar6 = fstat64(iVar4,(stat64 *)&statbuf);
      if (iVar6 != 0) {
        close(iVar4);
        uVar13 = *puVar1;
        pcVar16 = "Can\'t get the size of %s";
        goto LAB_0010a985;
      }
      (data_00->state).resume_from = statbuf.st_size;
    }
    CVar5 = CURLE_OK;
    local_160 = 0;
    do {
      if (CVar5 != CURLE_OK) break;
      CVar5 = Curl_fillreadbuffer(conn,(int)(data_00->set).buffer_size,(int *)header);
      if (CVar5 == CURLE_OK) {
        sVar18 = (size_t)(int)header._0_4_;
        CVar5 = CURLE_OK;
        if (0 < (long)sVar18) {
          lVar17 = (data_00->state).resume_from;
          pcVar16 = pcVar2;
          if (lVar17 != 0) {
            lVar15 = 0;
            if (lVar17 < (long)sVar18) {
              lVar15 = lVar17;
            }
            sVar11 = -(lVar17 - sVar18);
            cVar9 = lVar17 - sVar18;
            if (lVar17 < (long)sVar18) {
              cVar9 = 0;
            }
            else {
              sVar11 = 0;
            }
            (data_00->state).resume_from = cVar9;
            pcVar16 = pcVar2 + lVar15;
            sVar18 = sVar11;
          }
          sVar11 = write(iVar4,pcVar16,sVar18);
          if (sVar11 == sVar18) {
            local_160 = local_160 + sVar18;
            Curl_pgrsSetUploadCounter(data_00,local_160);
            iVar6 = Curl_pgrsUpdate(conn);
            bVar19 = true;
            CVar5 = CURLE_ABORTED_BY_CALLBACK;
            if (iVar6 == 0) {
              cVar21 = Curl_now();
              CVar5 = Curl_speedcheck(data_00,cVar21);
            }
            goto LAB_0010a627;
          }
          CVar5 = CURLE_SEND_ERROR;
        }
        bVar19 = false;
      }
      else {
        bVar19 = false;
      }
LAB_0010a627:
    } while (bVar19);
    if (CVar5 == CURLE_OK) {
      iVar6 = Curl_pgrsUpdate(conn);
      CVar5 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar6 == 0) {
        CVar5 = CURLE_OK;
      }
    }
    close(iVar4);
  }
  return CVar5;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = 0;
  bool size_known;
  bool fstated = FALSE;
  ssize_t nread;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    snprintf(header, sizeof(header),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    snprintf(header, sizeof(header),
             "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
             Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
             tm->tm_mday,
             Curl_month[tm->tm_mon],
             tm->tm_year + 1900,
             tm->tm_hour,
             tm->tm_min,
             tm->tm_sec);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(!result)
      /* set the file size to make it available post transfer */
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(conn);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}